

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_cmdline.cpp
# Opt level: O2

bool __thiscall
Omega_h::
CmdLineArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
parse_impl(CmdLineArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int *p_argc,char **argv,int i,bool should_print)

{
  std::__cxx11::string::assign((char *)&this->value_);
  shift(p_argc,argv,i);
  return true;
}

Assistant:

bool CmdLineArg<T>::parse_impl(
    int* p_argc, char** argv, int i, bool should_print) {
  if (!parse_arg(argv[i], &value_)) {
    if (should_print) {
      std::cout << "could not parse \"" << argv[i] << "\" as type "
                << ItemTraits<T>::name() << '\n';
    }
    return false;
  }
  shift(p_argc, argv, i);
  return true;
}